

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cmCryptoHash::Finalize
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          cmCryptoHash *this)

{
  int iVar1;
  ulong in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  iVar1 = rhash_get_digest_size(this->Id);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)iVar1,(value_type_conflict4 *)((long)&uStack_18 + 7),
             (allocator_type *)((long)&uStack_18 + 6));
  rhash_final(this->CTX,
              (__return_storage_ptr__->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> cmCryptoHash::Finalize()
{
  std::vector<unsigned char> hash(rhash_get_digest_size(this->Id), 0);
  rhash_final(this->CTX, &hash[0]);
  return hash;
}